

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uhttp.c
# Opt level: O2

void on_bytes_received(void *context,uchar *buffer,size_t len)

{
  uchar uVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  HTTP_HEADERS_RESULT HVar5;
  HTTP_HEADERS_HANDLE pHVar6;
  BUFFER_HANDLE pBVar7;
  LOGGER_LOG p_Var8;
  uchar *puVar9;
  size_t sVar10;
  long lVar11;
  char *value;
  __int32_t **pp_Var12;
  uchar *puVar13;
  size_t sVar14;
  uchar *puVar15;
  size_t index_1;
  uchar *puVar16;
  long lVar17;
  int iVar18;
  undefined8 extraout_RDX;
  undefined8 uVar19;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  bool bVar20;
  undefined4 uVar21;
  int iVar22;
  size_t index;
  size_t __n;
  ulong uVar23;
  uchar *puVar24;
  int iVar25;
  HTTP_CLIENT_HANDLE_DATA *http_data;
  char *pcVar26;
  ulong uVar27;
  uchar *puVar28;
  bool bVar29;
  uchar *in_stack_ffffffffffffff58;
  int local_8c;
  uchar *local_78;
  size_t count;
  uchar *local_58;
  ulong local_50;
  uint local_44;
  char *header;
  HTTP_HEADERS_HANDLE local_38;
  
  if (len == 0 || (buffer == (uchar *)0x0 || context == (void *)0x0)) {
    return;
  }
  uVar4 = *(uint *)((long)context + 0x4c);
  if (uVar4 == 0xb) {
    return;
  }
  if (uVar4 == 8) {
    setup_init_recv_msg((HTTP_RECV_DATA *)((long)context + 0x38));
    uVar4 = *(uint *)((long)context + 0x4c);
  }
  if ((uVar4 & 0xfffffffd) == 0) {
    if (*(long *)((long)context + 0x50) == 0) {
      pHVar6 = HTTPHeaders_Alloc();
      *(HTTP_HEADERS_HANDLE *)((long)context + 0x50) = pHVar6;
      if (pHVar6 != (HTTP_HEADERS_HANDLE)0x0) goto LAB_00104142;
      p_Var8 = xlogging_get_log_function();
      uVar21 = 0xb;
      if (p_Var8 != (LOGGER_LOG)0x0) {
        pcVar26 = "Failure creating Http header.";
        iVar3 = 0x75;
LAB_001041ac:
        uVar21 = 0xb;
        (*p_Var8)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                  ,"initialize_received_data",iVar3,1,pcVar26);
      }
    }
    else {
LAB_00104142:
      uVar21 = 3;
      if (*(long *)((long)context + 0x68) == 0) {
        pBVar7 = BUFFER_new();
        *(BUFFER_HANDLE *)((long)context + 0x68) = pBVar7;
        if (pBVar7 == (BUFFER_HANDLE)0x0) {
          p_Var8 = xlogging_get_log_function();
          uVar21 = 0xb;
          if (p_Var8 != (LOGGER_LOG)0x0) {
            pcVar26 = "Failure creating accrual buffer.";
            iVar3 = 0x7f;
            goto LAB_001041ac;
          }
        }
      }
    }
    *(undefined1 *)((long)context + 0x70) = 0;
    *(undefined4 *)((long)context + 0x4c) = uVar21;
  }
  iVar3 = BUFFER_append_build(*(BUFFER_HANDLE *)((long)context + 0x68),buffer,len);
  if (iVar3 != 0) {
    p_Var8 = xlogging_get_log_function();
    if (p_Var8 != (LOGGER_LOG)0x0) {
      iVar3 = 0x211;
LAB_00104209:
      (*p_Var8)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                ,"on_bytes_received",iVar3,1,"Failure appending bytes to buffer.");
    }
LAB_0010420e:
    *(undefined4 *)((long)context + 0x4c) = 0xb;
    goto LAB_00104217;
  }
  iVar3 = *(int *)((long)context + 0x4c);
  if (iVar3 == 3) {
    puVar9 = BUFFER_u_char(*(BUFFER_HANDLE *)((long)context + 0x68));
    sVar10 = BUFFER_length(*(BUFFER_HANDLE *)((long)context + 0x68));
    count._0_2_ = 0;
    count._2_1_ = '\0';
    iVar3 = 0;
    puVar13 = (uchar *)0x0;
    for (sVar14 = 1; count._3_1_ = 0, sVar14 - sVar10 != 1; sVar14 = sVar14 + 1) {
      if (puVar9[sVar14 - 1] == ' ') {
        if (iVar3 == 1) {
          count._2_1_ = puVar13[2];
          count._0_2_ = *(undefined2 *)puVar13;
        }
        else {
          puVar13 = puVar9 + sVar14;
        }
        iVar3 = iVar3 + 1;
      }
      else if (puVar9[sVar14 - 1] == '\n') {
        lVar11 = atol((char *)&count);
        *(int *)((long)context + 0x48) = (int)lVar11;
        if (0 < (int)lVar11) {
          iVar3 = BUFFER_shrink(*(BUFFER_HANDLE *)((long)context + 0x68),sVar14,false);
          if (iVar3 == 0) {
            *(undefined4 *)((long)context + 0x4c) = 4;
            goto LAB_0010432c;
          }
          p_Var8 = xlogging_get_log_function();
          if (p_Var8 == (LOGGER_LOG)0x0) goto LAB_0010420e;
          iVar3 = 0x220;
          goto LAB_00104209;
        }
        break;
      }
    }
    iVar3 = *(int *)((long)context + 0x4c);
  }
  if (iVar3 == 4) {
LAB_0010432c:
    puVar9 = BUFFER_u_char(*(BUFFER_HANDLE *)((long)context + 0x68));
    sVar14 = BUFFER_length(*(BUFFER_HANDLE *)((long)context + 0x68));
    local_38 = *(HTTP_HEADERS_HANDLE *)((long)context + 0x50);
    local_8c = 0xb2;
    bVar29 = true;
    local_50 = 0;
    pcVar26 = (char *)0x0;
    uVar23 = 0;
    bVar20 = false;
    puVar13 = puVar9;
    local_78 = puVar9;
    local_58 = puVar9;
    for (uVar27 = 0; (bVar29 && (uVar27 < sVar14)); uVar27 = uVar27 + 1) {
      puVar24 = puVar9 + uVar27;
      uVar1 = puVar9[uVar27];
      if (uVar1 == '\n') {
        if (bVar20) {
          bVar29 = true;
          sVar14 = uVar27 + 1;
          goto LAB_001046fe;
        }
        puVar13 = puVar24 + 1;
        bVar29 = true;
        uVar23 = 0;
        bVar20 = true;
      }
      else {
        bVar29 = true;
        if (uVar1 == '\r') {
          if (pcVar26 == (char *)0x0) {
            pcVar26 = (char *)0x0;
          }
          else {
            puVar28 = puVar13 + -1;
            puVar13 = puVar28;
            do {
              puVar28 = puVar28 + 1;
              puVar16 = puVar13 + 1;
              puVar13 = puVar13 + 1;
            } while (*puVar16 == ' ');
            puVar28 = local_78 + -(long)puVar28;
            if (puVar24 < puVar13) {
              puVar28 = (uchar *)0xffffffffffffffff;
            }
            puVar24 = puVar28 + 1;
            if (puVar28 + 1 == (uchar *)0x0) {
              puVar24 = (uchar *)0xffffffffffffffff;
            }
            local_44 = (uint)uVar23;
            if ((puVar24 == (uchar *)0xffffffffffffffff) ||
               (value = (char *)malloc((size_t)puVar24), value == (char *)0x0)) {
              p_Var8 = xlogging_get_log_function();
              local_8c = 0xf5;
              if (p_Var8 != (LOGGER_LOG)0x0) {
                (*p_Var8)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                          ,"process_header_line",0xf4,1,"Cannot malloc headerValue, size:%zu",
                          puVar24);
                in_stack_ffffffffffffff58 = puVar24;
              }
              bVar29 = false;
              value = (char *)0x0;
            }
            else {
              memcpy(value,puVar13,(size_t)puVar28);
              value[(long)puVar28] = '\0';
              HVar5 = HTTPHeaders_AddHeaderNameValuePair(local_38,pcVar26,value);
              if (HVar5 == HTTP_HEADERS_OK) {
                iVar3 = strcmp(pcVar26,"content-length");
                if (iVar3 == 0) {
                  *(undefined1 *)((long)context + 0x70) = 0;
                  lVar11 = atol(value);
                }
                else {
                  iVar3 = strcmp(pcVar26,"transfer-encoding");
                  if (iVar3 != 0) {
                    bVar29 = true;
                    local_50 = uVar27;
                    goto LAB_001046cc;
                  }
                  *(undefined1 *)((long)context + 0x70) = 1;
                  lVar11 = 0;
                }
                *(long *)((long)context + 0x60) = lVar11;
                bVar29 = true;
                local_50 = uVar27;
              }
              else {
                local_8c = 0x100;
                bVar29 = false;
              }
            }
LAB_001046cc:
            free(pcVar26);
            free(value);
            pcVar26 = (char *)0x0;
            uVar23 = (ulong)local_44;
          }
        }
        else if (uVar1 == ':') {
          if ((uVar23 & 1) == 0) {
            __n = (long)puVar24 - (long)puVar13;
            if (__n == 0) {
              p_Var8 = xlogging_get_log_function();
              puVar9 = local_58;
              local_8c = 0xc4;
              uVar19 = extraout_RDX_03;
              if (p_Var8 != (LOGGER_LOG)0x0) {
                (*p_Var8)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                          ,"process_header_line",0xc3,1,"Invalid header name with zero length.");
                uVar19 = extraout_RDX_04;
              }
              bVar29 = false;
              uVar23 = CONCAT71((int7)((ulong)uVar19 >> 8),1);
            }
            else {
              free(pcVar26);
              puVar9 = (uchar *)(__n + 1);
              if ((uchar *)(__n + 1) == (uchar *)0x0) {
                puVar9 = (uchar *)0xffffffffffffffff;
              }
              if ((puVar9 == (uchar *)0xffffffffffffffff) ||
                 (pcVar26 = (char *)malloc((size_t)puVar9), pcVar26 == (char *)0x0)) {
                p_Var8 = xlogging_get_log_function();
                local_8c = 0xd3;
                uVar19 = extraout_RDX_01;
                if (p_Var8 != (LOGGER_LOG)0x0) {
                  (*p_Var8)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                            ,"process_header_line",0xd2,1,"Cannot malloc headerKey, size:%zu",puVar9
                           );
                  uVar19 = extraout_RDX_02;
                  in_stack_ffffffffffffff58 = puVar9;
                }
                bVar29 = false;
                pcVar26 = (char *)0x0;
                uVar23 = CONCAT71((int7)((ulong)uVar19 >> 8),1);
                puVar9 = local_58;
              }
              else {
                memcpy(pcVar26,puVar13,__n);
                puVar9 = local_58;
                pcVar26[__n] = '\0';
                uVar19 = extraout_RDX;
                for (lVar11 = 0; (long)local_78 - (long)puVar13 != lVar11; lVar11 = lVar11 + 1) {
                  pp_Var12 = __ctype_tolower_loc();
                  pcVar26[lVar11] = (char)(*pp_Var12)[pcVar26[lVar11]];
                  uVar19 = extraout_RDX_00;
                }
                puVar13 = puVar24 + 1;
                bVar20 = false;
                uVar23 = CONCAT71((int7)((ulong)uVar19 >> 8),1);
                bVar29 = true;
              }
            }
          }
          else {
            bVar20 = false;
            bVar29 = true;
            uVar23 = CONCAT71((int7)(uVar23 >> 8),1);
          }
        }
        else {
          bVar20 = false;
        }
      }
      local_78 = local_78 + 1;
    }
    bVar29 = local_8c == 0;
    sVar14 = local_50;
LAB_001046fe:
    free(pcVar26);
    if (bVar29) {
      if (*(long *)((long)context + 0x60) == 0) {
        uVar4 = *(byte *)((long)context + 0x70) ^ 7;
      }
      else {
        uVar4 = 5;
      }
      *(uint *)((long)context + 0x4c) = uVar4;
    }
    if ((sVar14 == 0) ||
       (iVar3 = BUFFER_shrink(*(BUFFER_HANDLE *)((long)context + 0x68),sVar14,false), iVar3 == 0))
    goto LAB_0010477f;
    p_Var8 = xlogging_get_log_function();
    if (p_Var8 != (LOGGER_LOG)0x0) {
      pcVar26 = "Failure appending bytes to buffer.";
      iVar3 = 0x24a;
      goto LAB_0010484e;
    }
    goto LAB_00104853;
  }
LAB_0010477f:
  iVar3 = *(int *)((long)context + 0x4c);
  iVar22 = 7;
  if (iVar3 == 5) {
    if (*(long *)((long)context + 0x60) == 0) goto LAB_00104217;
    sVar14 = BUFFER_length(*(BUFFER_HANDLE *)((long)context + 0x68));
    uVar23 = *(ulong *)((long)context + 0x60);
    if (uVar23 == sVar14 || uVar23 == sVar14 - 4) {
      if (*(BUFFER_HANDLE *)((long)context + 0x58) != (BUFFER_HANDLE)0x0) {
        BUFFER_delete(*(BUFFER_HANDLE *)((long)context + 0x58));
      }
      pBVar7 = BUFFER_clone(*(BUFFER_HANDLE *)((long)context + 0x68));
      *(BUFFER_HANDLE *)((long)context + 0x58) = pBVar7;
      if (pBVar7 == (BUFFER_HANDLE)0x0) {
        p_Var8 = xlogging_get_log_function();
        if (p_Var8 != (LOGGER_LOG)0x0) {
          pcVar26 = "Failure cloning BUFFER.";
          iVar3 = 0x25e;
LAB_0010484e:
          (*p_Var8)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                    ,"on_bytes_received",iVar3,1,pcVar26);
        }
        goto LAB_00104853;
      }
    }
    else {
      if (sVar14 <= uVar23) {
        iVar3 = *(int *)((long)context + 0x4c);
        goto LAB_00104a36;
      }
      p_Var8 = xlogging_get_log_function();
      if (p_Var8 != (LOGGER_LOG)0x0) {
        pcVar26 = "Failure bytes encountered is greater then body length.";
        iVar3 = 0x268;
        goto LAB_0010484e;
      }
LAB_00104853:
      iVar22 = 0xb;
    }
LAB_00104856:
    *(int *)((long)context + 0x4c) = iVar22;
  }
  else {
LAB_00104a36:
    if (iVar3 == 6) {
      puVar13 = BUFFER_u_char(*(BUFFER_HANDLE *)((long)context + 0x68));
      sVar14 = BUFFER_length(*(BUFFER_HANDLE *)((long)context + 0x68));
      do {
        puVar28 = puVar13 + sVar14;
        puVar9 = puVar13;
        puVar24 = puVar13;
LAB_00104a87:
        puVar16 = puVar9;
        lVar11 = 0;
        puVar9 = puVar16;
        while( true ) {
          puVar15 = puVar9;
          if (puVar28 <= puVar16 + lVar11) goto LAB_00104217;
          if (puVar16[lVar11] == '\n') break;
          lVar11 = lVar11 + 1;
          puVar9 = puVar15 + 1;
          puVar24 = puVar15;
        }
        iVar3 = 0;
        for (lVar17 = 0; (long)puVar24 - (long)puVar16 != lVar17; lVar17 = lVar17 + 1) {
          bVar2 = puVar16[lVar17];
          if (bVar2 == 0x3b) break;
          if ((byte)(bVar2 - 0x30) < 10) {
            iVar18 = bVar2 - 0x30;
          }
          else if ((byte)(bVar2 + 0xbf) < 6) {
            iVar18 = bVar2 - 0x37;
          }
          else {
            iVar18 = bVar2 - 0x57;
            if (5 < (byte)(bVar2 + 0x9f)) {
              iVar18 = 0;
            }
          }
          iVar25 = iVar3 << 4;
          if (lVar17 == 0) {
            iVar25 = iVar3;
          }
          iVar3 = iVar25 + iVar18;
        }
        if (iVar3 == 0) {
          iVar22 = (uint)((uchar *)0xfffffffffffffffa < puVar16 + (lVar11 - (long)puVar28)) * 3 + 4;
          *(int *)((long)context + 0x4c) = iVar22;
          goto LAB_00104221;
        }
        sVar10 = (size_t)iVar3;
        if (puVar28 + (-lVar11 - (long)puVar16) <= (uchar *)(sVar10 + 2)) break;
        puVar9 = puVar16 + lVar11 + 1;
        iVar3 = BUFFER_append_build(*(BUFFER_HANDLE *)((long)context + 0x58),puVar9,sVar10);
        if (iVar3 != 0) {
          p_Var8 = xlogging_get_log_function();
          if (p_Var8 != (LOGGER_LOG)0x0) {
            (*p_Var8)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                      ,"on_bytes_received",0x29a,1,"Failure building buffer for chunked data.");
          }
          *(undefined4 *)((long)context + 0x4c) = 0xb;
          puVar24 = puVar9;
          goto LAB_00104a87;
        }
        puVar9 = puVar16 + lVar11 + sVar10 + 3;
        if (puVar28 < puVar9) {
          p_Var8 = xlogging_get_log_function();
          if (p_Var8 != (LOGGER_LOG)0x0) {
            pcVar26 = "Invalid length specified.";
            iVar3 = 0x2a2;
            goto LAB_00104d0a;
          }
LAB_00104d0f:
          iVar22 = 0xb;
          goto LAB_00104856;
        }
        if (puVar9 == puVar28) {
          iVar3 = BUFFER_shrink(*(BUFFER_HANDLE *)((long)context + 0x68),sVar14,false);
          if (iVar3 == 0) break;
          p_Var8 = xlogging_get_log_function();
          if (p_Var8 != (LOGGER_LOG)0x0) {
            pcVar26 = "Failure shrinking accural buffer.";
            iVar3 = 0x2aa;
LAB_00104d0a:
            (*p_Var8)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                      ,"on_bytes_received",iVar3,1,pcVar26);
          }
          goto LAB_00104d0f;
        }
        if ((*puVar9 == '0') &&
           ((uchar *)0xfffffffffffffffa < puVar16 + lVar11 + (sVar10 - (long)puVar28) + 3))
        goto LAB_00104856;
        puVar24 = puVar13;
        if (puVar9 == puVar13) goto LAB_00104a87;
        iVar3 = BUFFER_shrink(*(BUFFER_HANDLE *)((long)context + 0x68),
                              (size_t)(puVar16 + lVar11 + (sVar10 - (long)puVar13) + 3),false);
        if (iVar3 != 0) {
          p_Var8 = xlogging_get_log_function();
          if (p_Var8 != (LOGGER_LOG)0x0) {
            (*p_Var8)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                      ,"on_bytes_received",0x2ca,1,"Failure shrinking accrual buffer.");
          }
          *(undefined4 *)((long)context + 0x4c) = 0xb;
          puVar24 = puVar9;
          goto LAB_00104a87;
        }
        sVar14 = BUFFER_length(*(BUFFER_HANDLE *)((long)context + 0x68));
        puVar13 = BUFFER_u_char(*(BUFFER_HANDLE *)((long)context + 0x68));
      } while( true );
    }
LAB_00104217:
    iVar22 = *(int *)((long)context + 0x4c);
LAB_00104221:
    if (iVar22 != 7) {
      if (iVar22 == 8) goto LAB_00104975;
      if (iVar22 != 0xb) {
        return;
      }
    }
  }
  if (*(BUFFER_HANDLE *)((long)context + 0x58) == (BUFFER_HANDLE)0x0) {
    puVar13 = (uchar *)0x0;
    sVar14 = 0;
  }
  else {
    puVar13 = BUFFER_u_char(*(BUFFER_HANDLE *)((long)context + 0x58));
    sVar14 = BUFFER_length(*(BUFFER_HANDLE *)((long)context + 0x58));
    iVar22 = *(int *)((long)context + 0x4c);
  }
  if (*(char *)((long)context + 0x79) == '\x01') {
    p_Var8 = xlogging_get_log_function();
    if (p_Var8 != (LOGGER_LOG)0x0) {
      in_stack_ffffffffffffff58 =
           (uchar *)CONCAT44((int)((ulong)in_stack_ffffffffffffff58 >> 0x20),
                             *(undefined4 *)((long)context + 0x48));
      (*p_Var8)(AZ_LOG_TRACE,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                ,"on_bytes_received",0x2f4,1,"\r\nHTTP Status: %d\r\n",in_stack_ffffffffffffff58);
    }
    HVar5 = HTTPHeaders_GetHeaderCount(*(HTTP_HEADERS_HANDLE *)((long)context + 0x50),&count);
    uVar21 = (undefined4)((ulong)in_stack_ffffffffffffff58 >> 0x20);
    if (HVar5 == HTTP_HEADERS_RESULT_INVALID) {
      for (uVar23 = 0; uVar21 = (undefined4)((ulong)in_stack_ffffffffffffff58 >> 0x20),
          uVar23 < CONCAT44(count._4_4_,
                            CONCAT13(count._3_1_,CONCAT12(count._2_1_,(undefined2)count)));
          uVar23 = uVar23 + 1) {
        HVar5 = HTTPHeaders_GetHeader(*(HTTP_HEADERS_HANDLE *)((long)context + 0x50),uVar23,&header)
        ;
        if (HVar5 == HTTP_HEADERS_OK) {
          p_Var8 = xlogging_get_log_function();
          if (p_Var8 != (LOGGER_LOG)0x0) {
            in_stack_ffffffffffffff58 = (uchar *)header;
            (*p_Var8)(AZ_LOG_TRACE,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                      ,"on_bytes_received",0x2ff,1,"%s",header);
          }
          free(header);
        }
      }
    }
    if (((sVar14 != 0 & *(byte *)((long)context + 0x7a)) == 1) &&
       (p_Var8 = xlogging_get_log_function(), p_Var8 != (LOGGER_LOG)0x0)) {
      (*p_Var8)(AZ_LOG_TRACE,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                ,"on_bytes_received",0x306,1,"\r\n%.*s\r\n",CONCAT44(uVar21,(int)sVar14),puVar13);
    }
  }
  (**(code **)((long)context + 0x38))
            (*(undefined8 *)((long)context + 0x40),(iVar22 == 0xb) * '\x04' + '\x01',puVar13,sVar14,
             *(undefined4 *)((long)context + 0x48),*(undefined8 *)((long)context + 0x50));
  *(undefined4 *)((long)context + 0x4c) = 8;
LAB_00104975:
  HTTPHeaders_Free(*(HTTP_HEADERS_HANDLE *)((long)context + 0x50));
  *(undefined8 *)((long)context + 0x50) = 0;
  BUFFER_delete(*(BUFFER_HANDLE *)((long)context + 0x58));
  *(undefined8 *)((long)context + 0x58) = 0;
  BUFFER_delete(*(BUFFER_HANDLE *)((long)context + 0x68));
  *(undefined8 *)((long)context + 0x68) = 0;
  return;
}

Assistant:

static void on_bytes_received(void* context, const unsigned char* buffer, size_t len)
{
    HTTP_CLIENT_HANDLE_DATA* http_data = (HTTP_CLIENT_HANDLE_DATA*)context;

    if (http_data != NULL && buffer != NULL && len > 0 && http_data->recv_msg.recv_state != state_error)
    {
        if (http_data->recv_msg.recv_state == state_parse_complete)
        {
            // The callback is getting called during a new send.
            setup_init_recv_msg(&http_data->recv_msg);

        }

        if (http_data->recv_msg.recv_state == state_initial || http_data->recv_msg.recv_state == state_open)
        {
            if (initialize_received_data(http_data) != 0)
            {
                http_data->recv_msg.recv_state = state_error;
            }
            else
            {
                http_data->recv_msg.recv_state = state_process_status_line;
            }
        }

        // Put the data in the buffer
        if (BUFFER_append_build(http_data->recv_msg.accrual_buff, buffer, len) != 0)
        {
            /* Codes_SRS_UHTTP_07_048: [ If any error is encountered on_bytes_received shall set the state to error. ] */
            LogError("Failure appending bytes to buffer.");
            http_data->recv_msg.recv_state = state_error;
        }

        if (http_data->recv_msg.recv_state == state_process_status_line)
        {
            size_t index = 0;
            const unsigned char* stored_bytes = BUFFER_u_char(http_data->recv_msg.accrual_buff);
            size_t stored_len = BUFFER_length(http_data->recv_msg.accrual_buff);

            int lineComplete = process_status_code_line(stored_bytes, stored_len, &index, &http_data->recv_msg.status_code);
            if (lineComplete == 0 && http_data->recv_msg.status_code > 0)
            {
                if (BUFFER_shrink(http_data->recv_msg.accrual_buff, index, false) != 0)
                {
                    LogError("Failure appending bytes to buffer.");
                    http_data->recv_msg.recv_state = state_error;
                }
                else
                {
                    http_data->recv_msg.recv_state = state_process_headers;
                }
            }
        }

        if (http_data->recv_msg.recv_state == state_process_headers)
        {
            size_t index = 0;
            const unsigned char* stored_bytes = BUFFER_u_char(http_data->recv_msg.accrual_buff);
            size_t stored_len = BUFFER_length(http_data->recv_msg.accrual_buff);

            int headerComplete = process_header_line(stored_bytes, stored_len, &index, http_data->recv_msg.resp_header, &http_data->recv_msg.total_body_len, &http_data->recv_msg.chunked_reply);
            if (headerComplete == 0)
            {
                if (http_data->recv_msg.total_body_len == 0)
                {
                    if (http_data->recv_msg.chunked_reply)
                    {

                        /* Codes_SRS_UHTTP_07_054: [ If the http header does not include a content length then it indicates a chunk response. ] */
                        http_data->recv_msg.recv_state = state_process_chunked_body;
                    }
                    else
                    {
                        // Content len is 0 so we are finished with the body
                        http_data->recv_msg.recv_state = state_send_user_callback;
                    }
                }
                else
                {
                    http_data->recv_msg.recv_state = state_process_body;
                }
            }
            if (index > 0)
            {
                if (BUFFER_shrink(http_data->recv_msg.accrual_buff, index, false) != 0)
                {
                    LogError("Failure appending bytes to buffer.");
                    http_data->recv_msg.recv_state = state_error;
                }
            }
        }

        if (http_data->recv_msg.recv_state == state_process_body)
        {
            if (http_data->recv_msg.total_body_len != 0)
            {
                size_t stored_len = BUFFER_length(http_data->recv_msg.accrual_buff);

                if ((http_data->recv_msg.total_body_len == stored_len) || (http_data->recv_msg.total_body_len == (stored_len - HTTP_END_TOKEN_LEN)))
                {
                    if (http_data->recv_msg.msg_body != NULL)
                    {
                        BUFFER_delete(http_data->recv_msg.msg_body);
                    }
                    if ((http_data->recv_msg.msg_body = BUFFER_clone(http_data->recv_msg.accrual_buff)) == NULL)
                    {
                        LogError("Failure cloning BUFFER.");
                        http_data->recv_msg.recv_state = state_error;
                    }
                    else
                    {
                        http_data->recv_msg.recv_state = state_send_user_callback;
                    }
                }
                else if (stored_len > http_data->recv_msg.total_body_len)
                {
                    LogError("Failure bytes encountered is greater then body length.");
                    http_data->recv_msg.recv_state = state_error;
                }
            }
        }

        if (http_data->recv_msg.recv_state == state_process_chunked_body)
        {
            const unsigned char* iterator = BUFFER_u_char(http_data->recv_msg.accrual_buff);
            const unsigned char* initial_pos = iterator;
            const unsigned char* begin = iterator;
            const unsigned char* end = iterator;
            size_t accural_len = BUFFER_length(http_data->recv_msg.accrual_buff);

            /* Codes_SRS_UHTTP_07_059: [ on_bytes_received shall loop throught the stored data to find the /r/n separator. ] */
            while (iterator < (initial_pos + accural_len))
            {
                if (*iterator == '\r')
                {
                    // Don't need anything
                    end = iterator;
                    iterator++;
                }
                else if (*iterator == '\n')
                {
                    size_t data_length = 0;

                    /* Codes_SRS_UHTTP_07_055: [ on_bytes_received shall convert the hexs length supplied in the response to the data length of the chunked data. ] */
                    size_t hex_len = end - begin;
                    data_length = convert_char_to_hex(begin, hex_len);
                    if (data_length == 0)
                    {
                        if (accural_len - (iterator - initial_pos + 1) <= HTTP_END_TOKEN_LEN)
                        {
                            http_data->recv_msg.recv_state = state_send_user_callback;
                        }
                        else
                        {
                            // Need to continue parsing
                            http_data->recv_msg.recv_state = state_process_headers;
                        }
                        break;
                    }
                    else if ((data_length + HTTP_CRLF_LEN) < accural_len - (iterator - initial_pos))
                    {
                        /* Codes_SRS_UHTTP_07_056: [ After the response chunk is parsed it shall be placed in a BUFFER_HANDLE. ] */
                        iterator += 1;
                        if (BUFFER_append_build(http_data->recv_msg.msg_body, iterator, data_length) != 0)
                        {
                            /* Codes_SRS_UHTTP_07_048: [ If any error is encountered on_bytes_received shall set the stop processing the request. ] */
                            LogError("Failure building buffer for chunked data.");
                            http_data->recv_msg.recv_state = state_error;
                        }
                        else
                        {
                            /* Codes_SRS_UHTTP_07_060: [ if the data_length specified in the chunk is beyond the amount of data recieved, the parsing shall end and wait for more data. ] */
                            if (iterator + (data_length + HTTP_CRLF_LEN) > initial_pos + accural_len)
                            {
                                LogError("Invalid length specified.");
                                http_data->recv_msg.recv_state = state_error;
                                break;
                            }
                            else if (iterator + (data_length + HTTP_CRLF_LEN) == initial_pos + accural_len)
                            {
                                if (BUFFER_shrink(http_data->recv_msg.accrual_buff, accural_len, false) != 0)
                                {
                                    LogError("Failure shrinking accural buffer.");
                                    http_data->recv_msg.recv_state = state_error;
                                }
                                break;
                            }
                            else
                            {
                                // Move the iterator beyond the data we read and the /r/n
                                iterator += (data_length + HTTP_CRLF_LEN);
                            }

                            /* Codes_SRS_UHTTP_07_058: [ Once a chunk size value of 0 is encountered on_bytes_received shall call the on_request_callback with the http message ] */
                            if (*iterator == '0' && (accural_len - (iterator - initial_pos + 1) <= HTTP_END_TOKEN_LEN))
                            {
                                if (accural_len - (iterator - initial_pos + 1) <= HTTP_END_TOKEN_LEN)
                                {
                                    http_data->recv_msg.recv_state = state_send_user_callback;
                                }
                                else
                                {
                                    // Need to continue parsing
                                    http_data->recv_msg.recv_state = state_process_headers;
                                }
                                break;
                            }
                            else
                            {
                                size_t shrink_len = iterator - initial_pos;
                                if (shrink_len > 0)
                                {
                                    if (BUFFER_shrink(http_data->recv_msg.accrual_buff, shrink_len, false) != 0)
                                    {
                                        LogError("Failure shrinking accrual buffer.");
                                        http_data->recv_msg.recv_state = state_error;
                                    }
                                    else
                                    {
                                        accural_len = BUFFER_length(http_data->recv_msg.accrual_buff);
                                        initial_pos = iterator = BUFFER_u_char(http_data->recv_msg.accrual_buff);
                                    }
                                }
                            }
                        }
                        begin = end = iterator;
                    }
                    else
                    {
                        break;
                    }
                }
                else
                {
                    end = iterator;
                    iterator++;
                }
            }
        }

        if (http_data->recv_msg.recv_state == state_send_user_callback || http_data->recv_msg.recv_state == state_error)
        {
            const unsigned char* reply_data = NULL;
            size_t reply_len = 0;
            HTTP_CALLBACK_REASON http_reason = HTTP_CALLBACK_REASON_OK;
            if (http_data->recv_msg.msg_body != NULL)
            {
                reply_data = BUFFER_u_char(http_data->recv_msg.msg_body);
                reply_len = BUFFER_length(http_data->recv_msg.msg_body);
            }
            if (http_data->recv_msg.recv_state == state_error)
            {
                http_reason = HTTP_CALLBACK_REASON_PARSING_ERROR;
            }
            if (http_data->trace_on)
            {
                LOG(AZ_LOG_TRACE, LOG_LINE, "\r\nHTTP Status: %d\r\n", http_data->recv_msg.status_code);

                // Loop through headers
                size_t count;
                if (HTTPHeaders_GetHeaderCount(http_data->recv_msg.resp_header, &count) == 0)
                {
                    for (size_t index = 0; index < count; index++)
                    {
                        char* header;
                        if (HTTPHeaders_GetHeader(http_data->recv_msg.resp_header, index, &header) == HTTP_HEADERS_OK)
                        {
                            LOG(AZ_LOG_TRACE, LOG_LINE, "%s", header);
                            free(header);
                        }
                    }
                }
                if (http_data->trace_body && reply_len > 0)
                {
                    LOG(AZ_LOG_TRACE, LOG_LINE, "\r\n%.*s\r\n", (int)reply_len, reply_data);
                }
            }
            http_data->recv_msg.on_request_callback(http_data->recv_msg.user_ctx, http_reason, reply_data, reply_len, http_data->recv_msg.status_code, http_data->recv_msg.resp_header);
            http_data->recv_msg.recv_state = state_parse_complete;
        }

        if (http_data->recv_msg.recv_state == state_parse_complete)
        {
            HTTPHeaders_Free(http_data->recv_msg.resp_header);
            http_data->recv_msg.resp_header = NULL;
            BUFFER_delete(http_data->recv_msg.msg_body);
            http_data->recv_msg.msg_body = NULL;
            BUFFER_delete(http_data->recv_msg.accrual_buff);
            http_data->recv_msg.accrual_buff = NULL;
        }
    }
}